

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O3

void __thiscall
TasGrid::TasmanianSparseGrid::integrateHierarchicalFunctions
          (TasmanianSparseGrid *this,double *integrals)

{
  int num_dimensions;
  BaseCanonicalGrid *pBVar1;
  MultiIndexSet *pMVar2;
  TypeOneDRule rule;
  runtime_error *this_00;
  int i;
  long lVar3;
  long lVar4;
  double dVar5;
  
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    (*pBVar1->_vptr_BaseCanonicalGrid[0x23])();
    if ((this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pBVar1 = (this->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      num_dimensions = pBVar1->num_dimensions;
      rule = (*pBVar1->_vptr_BaseCanonicalGrid[7])();
      dVar5 = getQuadratureScale(this,num_dimensions,rule);
      pBVar1 = (this->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      lVar3 = 0;
      while( true ) {
        if (pBVar1 == (BaseCanonicalGrid *)0x0) {
          lVar4 = 0;
        }
        else {
          pMVar2 = &pBVar1->points;
          if (*(pointer *)
               &(pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl ==
              (pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pMVar2 = &pBVar1->needed;
          }
          lVar4 = (long)*(int *)((long)pMVar2 + 8);
        }
        if (lVar4 <= lVar3) break;
        integrals[lVar3] = integrals[lVar3] * dVar5;
        lVar3 = lVar3 + 1;
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"ERROR: cannot compute the integrals for a basis in an empty grid.");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TasmanianSparseGrid::integrateHierarchicalFunctions(double integrals[]) const{
    if (empty()) throw std::runtime_error("ERROR: cannot compute the integrals for a basis in an empty grid.");
    base->integrateHierarchicalFunctions(integrals);
    if (domain_transform_a.size() != 0){
        double scale = getQuadratureScale(base->getNumDimensions(), base->getRule());
        for(int i=0; i<getNumPoints(); i++) integrals[i] *= scale;
    }
}